

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void stat_sprint_scope(nni_stat *stat,char **scope,int *lenp)

{
  char *pcVar1;
  size_t sVar2;
  
  if (stat->s_parent != (nni_stat *)0x0) {
    stat_sprint_scope(stat->s_parent,scope,lenp);
  }
  pcVar1 = stat->s_info->si_name;
  if (*pcVar1 == '\0') {
    **scope = '\0';
  }
  else {
    snprintf(*scope,(long)*lenp,"%s#%d.",pcVar1,(ulong)(uint)(stat->s_val).sv_id);
  }
  pcVar1 = *scope;
  sVar2 = strlen(pcVar1);
  *lenp = *lenp - (int)sVar2;
  sVar2 = strlen(pcVar1);
  *scope = pcVar1 + sVar2;
  return;
}

Assistant:

void
stat_sprint_scope(const nni_stat *stat, char **scope, int *lenp)
{
	if (stat->s_parent != NULL) {
		stat_sprint_scope(stat->s_parent, scope, lenp);
	}
	if (strlen(stat->s_info->si_name) > 0) {
		snprintf(*scope, *lenp, "%s#%d.", stat->s_info->si_name,
		    stat->s_val.sv_id);
	} else {
		(*scope)[0] = '\0';
	}
	*lenp -= (int) strlen(*scope);
	*scope += strlen(*scope);
}